

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilCex.c
# Opt level: O0

void Abc_CexPrintStats(Abc_Cex_t *p)

{
  int iVar1;
  int local_18;
  int local_14;
  int Counter;
  int k;
  Abc_Cex_t *p_local;
  
  local_18 = 0;
  if (p == (Abc_Cex_t *)0x0) {
    printf("The counter example is NULL.\n");
  }
  else if (p == (Abc_Cex_t *)0x1) {
    printf("The counter example is present but not available (pointer has value \"1\").\n");
  }
  else {
    for (local_14 = 0; local_14 < p->nBits; local_14 = local_14 + 1) {
      iVar1 = Abc_InfoHasBit((uint *)(p + 1),local_14);
      local_18 = iVar1 + local_18;
    }
    printf("CEX: Po =%4d  Frame =%4d  FF = %d  PI = %d  Bit =%8d  1s =%8d (%5.2f %%)\n",
           ((double)local_18 * 100.0) / (double)(p->nBits - p->nRegs),(ulong)(uint)p->iPo,
           (ulong)(uint)p->iFrame,(ulong)(uint)p->nRegs,(ulong)(uint)p->nPis,(ulong)(uint)p->nBits,
           local_18);
  }
  return;
}

Assistant:

void Abc_CexPrintStats( Abc_Cex_t * p )
{
    int k, Counter = 0;
    if ( p == NULL )
    {
        printf( "The counter example is NULL.\n" );
        return;
    }
    if ( p == (Abc_Cex_t *)(ABC_PTRINT_T)1 )
    {
        printf( "The counter example is present but not available (pointer has value \"1\").\n" );
        return;
    }
    for ( k = 0; k < p->nBits; k++ )
        Counter += Abc_InfoHasBit(p->pData, k);
    printf( "CEX: Po =%4d  Frame =%4d  FF = %d  PI = %d  Bit =%8d  1s =%8d (%5.2f %%)\n", 
        p->iPo, p->iFrame, p->nRegs, p->nPis, p->nBits, 
        Counter, 100.0 * Counter / (p->nBits - p->nRegs) );
}